

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O3

void __thiscall MidiPlayerDialog::handlePlaybackFinished(MidiPlayerDialog *this,bool successful)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Master *this_00;
  QSettings *pQVar4;
  long *plVar5;
  QListWidgetItem *pQVar6;
  undefined7 in_register_00000031;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString local_b8;
  QFileInfo local_a0 [8];
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QArrayData *local_50 [3];
  QString local_38;
  
  QSpinBox::setValue((int)*(undefined8 *)(this->ui + 0xb0));
  if ((int)CONCAT71(in_register_00000031,successful) == 0) {
    this->stopped = true;
  }
  else {
    if (this->stopped == true) {
      this->stopped = false;
      pQVar6 = *(QListWidgetItem **)(this->ui + 0x18);
      QListWidget::row(pQVar6);
      QListWidget::setCurrentRow((int)pQVar6);
    }
    else {
      iVar2 = QListWidget::row(*(QListWidgetItem **)(this->ui + 0x18));
      if (iVar2 == -1) {
LAB_00166024:
        this->currentItem = (QListWidgetItem *)0x0;
        iVar2 = QListWidget::count();
        if (0 < iVar2) {
          QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
        }
        this->stopped = true;
        updateCurrentItem(this);
        return;
      }
      iVar3 = QListWidget::count();
      if (iVar3 <= iVar2 + 1) goto LAB_00166024;
      QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
      pQVar6 = (QListWidgetItem *)QListWidget::currentItem();
      this->currentItem = pQVar6;
      updateCurrentItem(this);
    }
    (**(code **)(*(long *)this->currentItem + 0x18))(&local_78,this->currentItem,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&local_78);
    SMFDriver::start(&this->smfDriver,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
      }
    }
    this_00 = Master::getInstance();
    pQVar4 = Master::getSettings(this_00);
    QVar7.m_data = (storage_type *)0x1d;
    QVar7.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar7);
    local_b8.d.d = (Data *)local_98.shared;
    local_b8.d.ptr = (char16_t *)local_98._8_8_;
    local_b8.d.size = local_98._16_8_;
    QVariant::QVariant((QVariant *)&local_98,"1");
    QSettings::value((QString *)local_78.data,(QVariant *)pQVar4);
    cVar1 = QVariant::toBool();
    QVariant::~QVariant((QVariant *)&local_78);
    QVariant::~QVariant((QVariant *)&local_98);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
      }
    }
    if (cVar1 != '\0') {
      QVar8.m_data = (storage_type *)0x11;
      QVar8.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar8);
      local_98.shared = local_78.shared;
      local_98._8_8_ = local_78._8_8_;
      local_98._16_8_ = local_78._16_8_;
      plVar5 = (long *)QListWidget::currentItem();
      (**(code **)(*plVar5 + 0x18))(&local_78,plVar5,0);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_78);
      QFileInfo::QFileInfo(local_a0,(QString *)local_50);
      QFileInfo::fileName();
      playbackStarted(this,(QString *)&local_98,&local_b8);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
      QFileInfo::~QFileInfo(local_a0);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,8);
        }
      }
      if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_98.shared = *(int *)local_98.shared + -1;
        UNLOCK();
        if (*(int *)local_98.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_98.shared,2,8);
        }
      }
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackFinished(bool successful) {
	ui->tempoSpinBox->setValue(MidiParser::DEFAULT_BPM);
	if (!successful) {
		stopped = true;
		return;
	}
	if (stopped) {
		stopped = false;
		ui->playList->setCurrentRow(ui->playList->row(currentItem));
	} else {
		int rowPlaying = ui->playList->row(currentItem);
		if (rowPlaying++ == -1 || ui->playList->count() <= rowPlaying) {
			currentItem = NULL;
			if (ui->playList->count() > 0) {
				ui->playList->setCurrentRow(0);
			}
			stopped = true;
			updateCurrentItem();
			return;
		}
		ui->playList->setCurrentRow(rowPlaying);
		currentItem = ui->playList->currentItem();
		updateCurrentItem();
	}
	smfDriver.start(currentItem->text());
	if (Master::getInstance()->getSettings()->value("Master/showConnectionBalloons", "1").toBool()) {
		emit playbackStarted("Playing MIDI file", QFileInfo(ui->playList->currentItem()->text()).fileName());
	}
}